

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullable.cpp
# Opt level: O2

ColumnRef __thiscall clickhouse::ColumnNullable::Slice(ColumnNullable *this,size_t begin,size_t len)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ColumnRef CVar2;
  undefined1 auStack_58 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  shared_ptr<clickhouse::Column> local_48;
  shared_ptr<clickhouse::Column> local_38;
  
  (**(code **)(**(long **)(begin + 0x28) + 0x38))(&local_48);
  (**(code **)(**(long **)(begin + 0x38) + 0x38))(auStack_58,*(long **)(begin + 0x38),len);
  std::
  make_shared<clickhouse::ColumnNullable,std::shared_ptr<clickhouse::Column>,std::shared_ptr<clickhouse::Column>>
            (&local_38,&local_48);
  _Var1._M_pi = local_38.super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  local_38.super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Column)._vptr_Column =
       (_func_int **)
       local_38.super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this->super_Column).super_enable_shared_from_this<clickhouse::Column>._M_weak_this.
  super___weak_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var1._M_pi;
  local_38.super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  CVar2.super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  CVar2.super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_Column;
  return (ColumnRef)CVar2.super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ColumnRef ColumnNullable::Slice(size_t begin, size_t len) {
    return std::make_shared<ColumnNullable>(nested_->Slice(begin, len), nulls_->Slice(begin, len));
}